

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O0

int HeadDataReplySeanet(SEANET *pSeanet,uchar *scanline,double *pAngle)

{
  int iVar1;
  HDCTRL HVar2;
  int local_834;
  undefined2 local_82e;
  int j;
  byte local_828 [2];
  uShort_SEANET word;
  int nbdatabytes;
  uchar databuf [2048];
  double *pAngle_local;
  uchar *scanline_local;
  SEANET *pSeanet_local;
  
  j = 0;
  databuf._2040_8_ = pAngle;
  memset(local_828,0,0x800);
  j = 0;
  iVar1 = GetMsgSeanet(pSeanet,2,local_828,0x800,&j);
  if (iVar1 == 0) {
    pSeanet->HeadStatus = (uint)databuf[8];
    local_82e = CONCAT11(databuf[0xb],databuf[10]);
    HVar2.u._2_2_ = 0;
    HVar2.u._0_2_ = local_82e;
    pSeanet->HeadHdCtrl = HVar2;
    local_82e = CONCAT11(databuf[0xd],databuf[0xc]);
    pSeanet->HeadRangescale = (uint)local_82e;
    pSeanet->HeadIGain = (uint)databuf[0x12];
    local_82e = CONCAT11(databuf[0x14],databuf[0x13]);
    pSeanet->HeadSlope = (uint)local_82e;
    pSeanet->HeadADSpan = (uint)databuf[0x15];
    pSeanet->HeadADLow = (uint)databuf[0x16];
    local_82e = CONCAT11(databuf[0x1a],databuf[0x19]);
    pSeanet->HeadADInterval = (uint)local_82e;
    local_82e = CONCAT11(databuf[0x1c],databuf[0x1b]);
    pSeanet->HeadLeftLim = (uint)local_82e;
    local_82e = CONCAT11(databuf[0x1e],databuf[0x1d]);
    pSeanet->HeadRightLim = (uint)local_82e;
    pSeanet->HeadSteps = (uint)databuf[0x1f];
    local_82e = CONCAT11(databuf[0x21],databuf[0x20]);
    *(double *)databuf._2040_8_ =
         (double)(int)((ulong)(long)(int)(local_82e + 0xc80) % 0x1900) * 0.05625;
    local_82e = CONCAT11(databuf[0x23],databuf[0x22]);
    pSeanet->Dbytes = (uint)local_82e;
    if (pSeanet->Dbytes + 0x2d == j) {
      if (pSeanet->adc8on == 0) {
        for (local_834 = 0; local_834 < pSeanet->Dbytes; local_834 = local_834 + 1) {
          scanline[local_834 << 1] = (uchar)(((int)(uint)local_828[local_834 + 0x2c] >> 4) << 4);
          scanline[local_834 * 2 + 1] =
               (uchar)(((int)((uint)local_828[local_834 + 0x2c] << 4) >> 4) << 4);
        }
        pSeanet->HeadNBins = pSeanet->Dbytes << 1;
      }
      else {
        memcpy(scanline,databuf + 0x24,(long)pSeanet->Dbytes);
        pSeanet->HeadNBins = pSeanet->Dbytes;
      }
      pSeanet_local._4_4_ = 0;
    }
    else {
      printf("A Seanet is not responding correctly. \n");
      pSeanet_local._4_4_ = 1;
    }
  }
  else {
    printf("A Seanet is not responding correctly. \n");
    pSeanet_local._4_4_ = 1;
  }
  return pSeanet_local._4_4_;
}

Assistant:

inline int HeadDataReplySeanet(SEANET* pSeanet, unsigned char* scanline, double* pAngle)
{
	unsigned char databuf[MAX_NB_BYTES_SEANET];
	int nbdatabytes = 0;
	uShort_SEANET word;
	int j = 0;

	// Wait for a mtHeadData message.
	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	//if (GetLatestMsgSeanet(pSeanet, mtHeadData, databuf, sizeof(databuf), &nbdatabytes)
	//	!= EXIT_SUCCESS)
	if (GetMsgSeanet(pSeanet, mtHeadData, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		printf("A Seanet is not responding correctly. \n");
		return EXIT_FAILURE;	
	}

	// Analyze data.

	//memset(pSeanetData, 0, sizeof(SEANETDATA));

	// Head Status.
	pSeanet->HeadStatus = (unsigned char)databuf[16];

	// HdCtrl.
	word.c[0] = (unsigned char)databuf[18]; // LSB.
	word.c[1] = (unsigned char)databuf[19]; // MSB.
	pSeanet->HeadHdCtrl.i = word.v;

	// Rangescale. Normally, we should check the unit but it should have been requested in m...
	word.c[0] = (unsigned char)databuf[20]; // LSB.
	word.c[1] = (unsigned char)databuf[21]; // MSB.
	pSeanet->HeadRangescale = word.v;

	// Gain.
	pSeanet->HeadIGain = (unsigned char)databuf[26];

	// Slope.
	word.c[0] = (unsigned char)databuf[27]; // LSB.
	word.c[1] = (unsigned char)databuf[28]; // MSB.
	pSeanet->HeadSlope = word.v;

	// ADSpan.
	pSeanet->HeadADSpan = (unsigned char)databuf[29];

	// ADLow.
	pSeanet->HeadADLow = (unsigned char)databuf[30];

	// ADInterval.
	word.c[0] = (unsigned char)databuf[33]; // LSB.
	word.c[1] = (unsigned char)databuf[34]; // MSB.
	pSeanet->HeadADInterval = word.v;

	// LeftLim.
	word.c[0] = (unsigned char)databuf[35]; // LSB.
	word.c[1] = (unsigned char)databuf[36]; // MSB.
	pSeanet->HeadLeftLim = word.v;

	// RightLim.
	word.c[0] = (unsigned char)databuf[37]; // LSB.
	word.c[1] = (unsigned char)databuf[38]; // MSB.
	pSeanet->HeadRightLim = word.v;

	// Steps.
	pSeanet->HeadSteps = (unsigned char)databuf[39];

	// Transducer Bearing. 
	// This is the position of the transducer for the current scanline (0..6399 in 1/16 Gradian units).

	// Ahead corresponds to 3200?

	word.c[0] = (unsigned char)databuf[40]; // LSB.
	word.c[1] = (unsigned char)databuf[41]; // MSB.
	*pAngle = ((word.v-3200+6400)%6400)*0.05625; // Angle of the transducer in degrees (0.05625 = (1/16)*(9/10)).

	// Dbytes.
	word.c[0] = (unsigned char)databuf[42]; // LSB.
	word.c[1] = (unsigned char)databuf[43]; // MSB.
	pSeanet->Dbytes = word.v; // Dbytes defines the number of Range Bins that the sonar will generate for the Head Data reply message.

	// There are 44 bytes of Message Header and Device Parameter Block.

	if (44+pSeanet->Dbytes+1 != nbdatabytes)
	{ 
		printf("A Seanet is not responding correctly. \n");
		return EXIT_FAILURE;	
	}

	// We should take into account ADLow and ADSpan here?

	// Retrieve the scanline data from the data received.
	if (!pSeanet->adc8on)	
	{ 
		// If adc8on = 0, the scanlines data received are in 4 bit (1/2 byte).
		// The amplitude values are between 0 and 15 so we multiply by 16
		// to get values between 0 and 255.
		for (j = 0; j < pSeanet->Dbytes; j++)
		{
			scanline[2*j+0] = (unsigned char)((databuf[j+44]>>4)*16);
			scanline[2*j+1] = (unsigned char)(((databuf[j+44]<<4)>>4)*16);
		}
		pSeanet->HeadNBins = 2*pSeanet->Dbytes;
	}
	else	
	{
		// If adc8on = 1, the scanlines data received are in 8 bit (1 byte).
		// The amplitude values are between 0 and 255.
		memcpy(scanline, databuf+44, pSeanet->Dbytes); // Copy the data received without the header (which was the 44 first bytes).
		pSeanet->HeadNBins = pSeanet->Dbytes;
	}

	// Last data...?

	return EXIT_SUCCESS;
}